

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall
cmMakefile::GetModulesFile
          (string *__return_storage_ptr__,cmMakefile *this,string *filename,bool *system,bool debug,
          string *debugBuffer)

{
  string_view arg;
  bool bVar1;
  PolicyStatus PVar2;
  reference pbVar3;
  string *psVar4;
  ulong uVar5;
  ostream *poVar6;
  PolicyID id;
  string local_4b0;
  string local_490;
  undefined1 local_470 [8];
  ostringstream e;
  undefined1 local_2f8 [8];
  string mods;
  string local_2d0;
  cmValue local_2b0;
  cmValue currentFile;
  cmAlphaNum local_278;
  string local_248;
  cmAlphaNum local_228;
  cmAlphaNum local_1f8;
  string local_1c8;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  string local_148;
  int local_124;
  undefined1 local_120 [8];
  string itempl;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  allocator<char> local_a9;
  string local_a8;
  cmValue local_88;
  cmValue cmakeModulePath;
  string moduleInCMakeModulePath;
  string moduleInCMakeRoot;
  string *debugBuffer_local;
  bool debug_local;
  bool *system_local;
  string *filename_local;
  cmMakefile *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&cmakeModulePath);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_MODULE_PATH",&local_a9);
  local_88 = GetDefinition(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  bVar1 = cmValue::operator_cast_to_bool(&local_88);
  if (bVar1) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_88);
    arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8,arg,false);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_d8);
    itempl.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&itempl.field_2 + 8)), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string((string *)local_120,(string *)pbVar3);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_120);
      std::__cxx11::string::operator+=((string *)local_120,"/");
      std::__cxx11::string::operator+=((string *)local_120,(string *)filename);
      bVar1 = cmsys::SystemTools::FileExists((string *)local_120);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&cmakeModulePath,(string *)local_120);
        local_124 = 2;
      }
      else {
        if (debug) {
          cmAlphaNum::cmAlphaNum(&local_178,debugBuffer);
          cmAlphaNum::cmAlphaNum(&local_1a8,"  ");
          cmStrCat<std::__cxx11::string,char[2]>
                    (&local_148,&local_178,&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     (char (*) [2])0xd5e5f1);
          std::__cxx11::string::operator=((string *)debugBuffer,(string *)&local_148);
          std::__cxx11::string::~string((string *)&local_148);
        }
        local_124 = 0;
      }
      std::__cxx11::string::~string((string *)local_120);
      if (local_124 != 0) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
  }
  psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  cmAlphaNum::cmAlphaNum(&local_1f8,psVar4);
  cmAlphaNum::cmAlphaNum(&local_228,"/Modules/");
  cmStrCat<std::__cxx11::string>(&local_1c8,&local_1f8,&local_228,filename);
  std::__cxx11::string::operator=
            ((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8),(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  cmsys::SystemTools::ConvertToUnixSlashes
            ((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  bVar1 = cmsys::SystemTools::FileExists((string *)((long)&moduleInCMakeModulePath.field_2 + 8));
  if (!bVar1) {
    if (debug) {
      cmAlphaNum::cmAlphaNum(&local_278,debugBuffer);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&currentFile,"  ");
      cmStrCat<std::__cxx11::string,char[2]>
                (&local_248,&local_278,(cmAlphaNum *)&currentFile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&moduleInCMakeModulePath.field_2 + 8),(char (*) [2])0xd5e5f1);
      std::__cxx11::string::operator=((string *)debugBuffer,(string *)&local_248);
      std::__cxx11::string::~string((string *)&local_248);
    }
    std::__cxx11::string::clear();
  }
  *system = false;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&cmakeModulePath);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    *system = true;
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  }
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) != 0) || (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0))
  goto LAB_0041e5b7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"CMAKE_CURRENT_LIST_FILE",
             (allocator<char> *)(mods.field_2._M_local_buf + 0xf));
  local_2b0 = GetDefinition(this,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)(mods.field_2._M_local_buf + 0xf));
  psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                 psVar4,"/Modules/");
  bVar1 = cmValue::operator_cast_to_bool(&local_2b0);
  if (bVar1) {
    psVar4 = cmValue::operator*[abi_cxx11_(&local_2b0);
    bVar1 = cmsys::SystemTools::IsSubDirectory(psVar4,(string *)local_2f8);
    if (bVar1) {
      PVar2 = GetPolicyStatus(this,CMP0017,false);
      if (PVar2 != OLD) {
        if (PVar2 != WARN) {
          if (PVar2 - NEW < 3) {
            *system = true;
            std::__cxx11::string::operator=
                      ((string *)__return_storage_ptr__,
                       (string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
          }
          goto LAB_0041e59b;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
        poVar6 = std::operator<<((ostream *)local_470,"File ");
        psVar4 = cmValue::operator*[abi_cxx11_(&local_2b0);
        poVar6 = std::operator<<(poVar6,(string *)psVar4);
        poVar6 = std::operator<<(poVar6," includes ");
        poVar6 = std::operator<<(poVar6,(string *)&cmakeModulePath);
        poVar6 = std::operator<<(poVar6," (found via CMAKE_MODULE_PATH) which shadows ");
        poVar6 = std::operator<<(poVar6,(string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8)
                                );
        poVar6 = std::operator<<(poVar6,". This may cause errors later on .\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_490,(cmPolicies *)0x11,id);
        std::operator<<(poVar6,(string *)&local_490);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::ostringstream::str();
        IssueMessage(this,AUTHOR_WARNING,&local_4b0);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      }
      *system = false;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&cmakeModulePath);
    }
  }
LAB_0041e59b:
  std::__cxx11::string::~string((string *)local_2f8);
LAB_0041e5b7:
  local_124 = 1;
  std::__cxx11::string::~string((string *)&cmakeModulePath);
  std::__cxx11::string::~string((string *)(moduleInCMakeModulePath.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetModulesFile(const std::string& filename,
                                       bool& system, bool debug,
                                       std::string& debugBuffer) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  cmValue cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath = cmExpandedList(*cmakeModulePath);

    // Look through the possible module directories.
    for (std::string itempl : modulePath) {
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl)) {
        moduleInCMakeModulePath = itempl;
        break;
      }
      if (debug) {
        debugBuffer = cmStrCat(debugBuffer, "  ", itempl, "\n");
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot =
    cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules/", filename);
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot)) {
    if (debug) {
      debugBuffer = cmStrCat(debugBuffer, "  ", moduleInCMakeRoot, "\n");
    }
    moduleInCMakeRoot.clear();
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  system = false;
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    system = true;
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    cmValue currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(*currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << *currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          system = false;
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          system = true;
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}